

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_concat(lua_State *L,CallInfo *ci,int a,int b,int c)

{
  ushort uVar1;
  int iVar2;
  StkId pTVar3;
  GCObject *pGVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  global_State *pgVar9;
  
  L->top = (StkId)((ci->u).c.k + (long)c * 0x10 + 0x10);
  luaV_concat(L,(c - b) + 1);
  pTVar3 = (ci->u).l.base;
  lVar7 = (long)b;
  lVar6 = (long)a;
  pGVar4 = pTVar3[lVar7].value_.gc;
  pTVar3[lVar6].value_.gc = pGVar4;
  uVar1 = pTVar3[lVar7].tt_;
  pTVar3[lVar6].tt_ = uVar1;
  if ((short)uVar1 < 0) {
    if (((uVar1 & 0x7f) != (ushort)pGVar4->tt) ||
       (pgVar9 = L->l_G, (pGVar4->marked & (pgVar9->currentwhite ^ 0x18)) != 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb71,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
    }
  }
  else {
    pgVar9 = L->l_G;
  }
  if (0 < pgVar9->GCdebt) {
    lVar6 = lVar6 + 1;
    if (a < b) {
      lVar6 = lVar7;
    }
    L->top = pTVar3 + lVar6;
    luaC_step(L);
    L->top = ci->top;
  }
  piVar5 = *(int **)&L[-1].hookmask;
  iVar2 = *piVar5;
  iVar8 = iVar2 + -1;
  *piVar5 = iVar8;
  if (iVar8 == 0) {
    *piVar5 = iVar2;
    L->top = ci->top;
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xb72,"void raviV_op_concat(lua_State *, CallInfo *, int, int, int)");
}

Assistant:

void raviV_op_concat(lua_State *L, CallInfo *ci, int a, int b, int c) {
  StkId rb, ra;
  StkId base = ci->u.l.base;
  L->top = base + c + 1; /* mark the end of concat operands */
  Protect_base(luaV_concat(L, c - b + 1));
  ra = base + a; /* 'luav_concat' may invoke TMs and move the stack */
  rb = base + b;
  setobjs2s(L, ra, rb);
  checkGC_protectbase(L, (ra >= rb ? ra + 1 : rb));
  L->top = ci->top; /* restore top */
}